

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmNinjaTargetGenerator::LanguageDyndepRule
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,string *lang,string *config)

{
  string *name;
  char local_a9;
  string local_a8;
  cmAlphaNum local_88;
  cmAlphaNum local_58;
  string *local_28;
  string *config_local;
  string *lang_local;
  cmNinjaTargetGenerator *this_local;
  
  local_28 = config;
  config_local = lang;
  lang_local = (string *)this;
  this_local = (cmNinjaTargetGenerator *)__return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_58,lang);
  cmAlphaNum::cmAlphaNum(&local_88,"_DYNDEP__");
  name = cmGeneratorTarget::GetName_abi_cxx11_
                   ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  cmGlobalNinjaGenerator::EncodeRuleName(&local_a8,name);
  local_a9 = '_';
  cmStrCat<std::__cxx11::string,char,std::__cxx11::string>
            (__return_storage_ptr__,&local_58,&local_88,&local_a8,&local_a9,local_28);
  std::__cxx11::string::~string((string *)&local_a8);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::LanguageDyndepRule(
  const std::string& lang, const std::string& config) const
{
  return cmStrCat(
    lang, "_DYNDEP__",
    cmGlobalNinjaGenerator::EncodeRuleName(this->GeneratorTarget->GetName()),
    '_', config);
}